

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonEx(char *label,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id_00;
  ImGuiWindow *this;
  ImGuiCol local_b4;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImU32 local_88;
  byte local_83;
  bool local_82;
  bool local_81;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  undefined1 local_78 [8];
  ImRect bb;
  ImVec2 local_5c;
  ImVec2 size;
  ImVec2 pos;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiButtonFlags flags_local;
  ImVec2 *size_arg_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar3 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    pos = CalcTextSize(label,(char *)0x0,true,-1.0);
    size = (this->DC).CursorPos;
    if (((flags & 0x8000U) != 0) &&
       ((pIVar3->Style).FramePadding.y < (this->DC).CurrLineTextBaseOffset)) {
      size.y = ((this->DC).CurrLineTextBaseOffset - (pIVar3->Style).FramePadding.y) + size.y;
    }
    bb.Max = *size_arg;
    fVar1 = (pIVar3->Style).FramePadding.x;
    fVar2 = (pIVar3->Style).FramePadding.y;
    local_5c = CalcItemSize(bb.Max,fVar1 + fVar1 + pos.x,fVar2 + fVar2 + pos.y);
    _col = operator+(&size,&local_5c);
    ImRect::ImRect((ImRect *)local_78,&size,(ImVec2 *)&col);
    ItemSize(&local_5c,(pIVar3->Style).FramePadding.y);
    bVar4 = ItemAdd((ImRect *)local_78,id_00,(ImRect *)0x0,0);
    if (bVar4) {
      window._4_4_ = flags;
      if (((pIVar3->LastItemData).InFlags & 2U) != 0) {
        window._4_4_ = flags | 0x400;
      }
      local_83 = ButtonBehavior((ImRect *)local_78,id_00,&local_81,&local_82,window._4_4_);
      if (((local_82 & 1U) == 0) || ((local_81 & 1U) == 0)) {
        local_b4 = 0x15;
        if ((local_81 & 1U) != 0) {
          local_b4 = 0x16;
        }
      }
      else {
        local_b4 = 0x17;
      }
      local_88 = GetColorU32(local_b4,1.0);
      RenderNavHighlight((ImRect *)local_78,id_00,1);
      local_90.x = (float)local_78._0_4_;
      local_90.y = (float)local_78._4_4_;
      local_98 = bb.Min;
      RenderFrame((ImVec2)local_78,bb.Min,local_88,true,(pIVar3->Style).FrameRounding);
      if ((pIVar3->LogEnabled & 1U) != 0) {
        LogSetNextTextDecoration("[","]");
      }
      local_a0 = operator+((ImVec2 *)local_78,&(pIVar3->Style).FramePadding);
      local_a8 = ::operator-(&bb.Min,&(pIVar3->Style).FramePadding);
      RenderTextClipped(&local_a0,&local_a8,label,(char *)0x0,&pos,&(pIVar3->Style).ButtonTextAlign,
                        (ImRect *)local_78);
      label_local._7_1_ = (bool)(local_83 & 1);
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::ButtonEx(const char* label, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    ImVec2 pos = window->DC.CursorPos;
    if ((flags & ImGuiButtonFlags_AlignTextBaseLine) && style.FramePadding.y < window->DC.CurrLineTextBaseOffset) // Try to vertically align buttons that are smaller/have no padding so that text baseline matches (bit hacky, since it shouldn't be a flag)
        pos.y += window->DC.CurrLineTextBaseOffset - style.FramePadding.y;
    ImVec2 size = CalcItemSize(size_arg, label_size.x + style.FramePadding.x * 2.0f, label_size.y + style.FramePadding.y * 2.0f);

    const ImRect bb(pos, pos + size);
    ItemSize(size, style.FramePadding.y);
    if (!ItemAdd(bb, id))
        return false;

    if (g.LastItemData.InFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, style.FrameRounding);

    if (g.LogEnabled)
        LogSetNextTextDecoration("[", "]");
    RenderTextClipped(bb.Min + style.FramePadding, bb.Max - style.FramePadding, label, NULL, &label_size, style.ButtonTextAlign, &bb);

    // Automatically close popups
    //if (pressed && !(flags & ImGuiButtonFlags_DontClosePopups) && (window->Flags & ImGuiWindowFlags_Popup))
    //    CloseCurrentPopup();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return pressed;
}